

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall capnp::JsonCodec::decode(JsonCodec *this,Reader input,Builder output)

{
  HandlerBase *pHVar1;
  Reader input_00;
  Builder builder;
  Builder output_00;
  Impl *pIVar2;
  undefined8 in_stack_fffffffffffffe78;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_108 [8];
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  Orphanage local_d8;
  StructSchema local_c8;
  undefined8 local_c0 [6];
  undefined1 local_90 [48];
  undefined1 local_60 [48];
  HandlerBase **local_30;
  HandlerBase **handler;
  HandlerBase **local_20;
  HandlerBase **_handler426;
  StructSchema type;
  JsonCodec *this_local;
  
  type.super_Schema.raw = (Schema)(Schema)this;
  _handler426 = (HandlerBase **)DynamicStruct::Builder::getSchema(&output);
  pIVar2 = kj::Own<capnp::JsonCodec::Impl,_std::nullptr_t>::operator->(&this->impl);
  kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::find<capnp::StructSchema&>
            ((HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*> *)&handler,
             (StructSchema *)&pIVar2->typeHandlers);
  local_30 = kj::_::readMaybe<capnp::JsonCodec::HandlerBase*const>
                       ((Maybe<capnp::JsonCodec::HandlerBase_*const_&> *)&handler);
  local_20 = local_30;
  if (local_30 == (HandlerBase **)0x0) {
    memcpy(local_c0,&input,0x30);
    local_c8.super_Schema.raw = (Schema)(Schema)_handler426;
    memcpy(local_108,&output,0x30);
    builder.builder.segment._0_4_ = (int)local_f8;
    builder.schema.super_Schema.raw = (Schema)(Schema)uStack_100;
    builder.builder.segment._4_4_ = (int)((ulong)local_f8 >> 0x20);
    builder.builder.capTable._0_4_ = (int)uStack_f0;
    builder.builder.capTable._4_4_ = (int)((ulong)uStack_f0 >> 0x20);
    builder.builder.data._0_4_ = (int)local_e8;
    builder.builder.data._4_4_ = (int)((ulong)local_e8 >> 0x20);
    builder.builder.pointers._0_4_ = (int)uStack_e0;
    builder.builder.pointers._4_4_ = (int)((ulong)uStack_e0 >> 0x20);
    builder.builder.dataSize = (int)in_stack_fffffffffffffe78;
    builder.builder.pointerCount = (short)((ulong)in_stack_fffffffffffffe78 >> 0x20);
    builder.builder._38_2_ = (short)((ulong)in_stack_fffffffffffffe78 >> 0x30);
    local_d8 = Orphanage::getForMessageContaining<capnp::DynamicStruct::Builder>(builder);
    memcpy(&local_138,&output,0x30);
    input_00._reader.capTable._0_4_ = (int)local_c0[1];
    input_00._reader.segment = (SegmentReader *)local_c0[0];
    input_00._reader.capTable._4_4_ = (int)((ulong)local_c0[1] >> 0x20);
    input_00._reader.data._0_4_ = (int)local_c0[2];
    input_00._reader.data._4_4_ = (int)((ulong)local_c0[2] >> 0x20);
    input_00._reader.pointers._0_4_ = (int)local_c0[3];
    input_00._reader.pointers._4_4_ = (int)((ulong)local_c0[3] >> 0x20);
    input_00._reader.dataSize = (int)local_c0[4];
    input_00._reader._36_4_ = (int)((ulong)local_c0[4] >> 0x20);
    input_00._reader.nestingLimit = (int)local_c0[5];
    input_00._reader._44_4_ = (int)((ulong)local_c0[5] >> 0x20);
    output_00.builder.segment = (SegmentBuilder *)uStack_130;
    output_00.schema.super_Schema.raw = (Schema)(Schema)local_138;
    output_00.builder.capTable = (CapTableBuilder *)local_128;
    output_00.builder.data = (void *)uStack_120;
    output_00.builder.pointers = (WirePointer *)local_118;
    output_00.builder.dataSize = (undefined4)uStack_110;
    output_00.builder.pointerCount = uStack_110._4_2_;
    output_00.builder._38_2_ = uStack_110._6_2_;
    decodeObject(this,input_00,local_c8,local_d8,output_00);
  }
  else {
    pHVar1 = *local_30;
    memcpy(local_60,&input,0x30);
    memcpy(local_90,&output,0x30);
    (*pHVar1->_vptr_HandlerBase[2])(pHVar1,this);
  }
  return;
}

Assistant:

void JsonCodec::decode(JsonValue::Reader input, DynamicStruct::Builder output) const {
  auto type = output.getSchema();

  KJ_IF_SOME(handler, impl->typeHandlers.find(type)) {
    return handler->decodeStructBase(*this, input, output);
  }

  decodeObject(input, type, Orphanage::getForMessageContaining(output), output);
}